

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O2

void __thiscall
Script_ParseCoinbaseScriptsigTest_Test::TestBody(Script_ParseCoinbaseScriptsigTest_Test *this)

{
  _func_int **message;
  char *pcVar1;
  char *in_R9;
  bool bVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> list;
  AssertHelper local_70;
  string script;
  Script obj;
  
  std::__cxx11::string::string
            ((string *)&script,
             "03632b1e045352b260425443506f6f6cfabe6d6d4b081c2a3c7cb234c159b8e198294dfa79c04b54803e0e54c4a37d239445eb42020000007296cd100100000e8338000000000000"
             ,(allocator *)&obj);
  cfd::core::Script::Script(&obj,&script);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_1,&obj);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&list,"script","obj.GetHex()",&script,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if ((char)list.
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (list.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      message = (_func_int **)0x4d37ee;
    }
    else {
      message = (list.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_vptr_ScriptElement;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
               ,0x21b,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&list.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  cfd::core::Script::GetElementList(&list,&obj);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_3_ = 0;
  gtest_ar_._0_8_ =
       ((long)list.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       CONCAT71(list.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                (char)list.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_start)) / 0x60;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_1,"3","list.size()",(int *)&gtest_ar_2,
             (unsigned_long *)&gtest_ar_);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
               ,0x21d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  if ((long)list.
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)CONCAT71(list.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                     (char)list.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_start) == 0x120) {
    cfd::core::ScriptElement::GetData
              ((ByteData *)&gtest_ar_,
               (ScriptElement *)
               CONCAT71(list.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                        (char)list.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data._M_start));
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_);
    testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
              ((internal *)&gtest_ar_2,"\"03632b1e\"","list[0].GetData().GetHex()",
               (char (*) [9])"03632b1e",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
                 ,0x21f,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::ScriptElement::GetData
              ((ByteData *)&gtest_ar_,
               (ScriptElement *)
               (CONCAT71(list.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)list.
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_start) + 0x60));
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_);
    testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
              ((internal *)&gtest_ar_2,"\"045352b260\"","list[1].GetData().GetHex()",
               (char (*) [11])"045352b260",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
                 ,0x220,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar2 = *(int *)(CONCAT71(list.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              (char)list.
                                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start) + 200) == 1;
    gtest_ar_.success_ = bVar2;
    if (!bVar2) {
      testing::Message::Message((Message *)&gtest_ar_2);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                 (AssertionResult *)"list[2].IsBinary()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
                 ,0x221,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_2);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_2);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    cfd::core::ScriptElement::GetBinaryData
              ((ByteData *)&gtest_ar_,
               (ScriptElement *)
               (CONCAT71(list.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)list.
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_start) + 0xc0));
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_);
    testing::internal::CmpHelperEQ<char[125],std::__cxx11::string>
              ((internal *)&gtest_ar_2,
               "\"5443506f6f6cfabe6d6d4b081c2a3c7cb234c159b8e198294dfa79c04b54803e0e54c4a37d239445eb42020000007296cd100100000e8338000000000000\""
               ,"list[2].GetBinaryData().GetHex()",(char (*) [125])0x40f59c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
                 ,0x225,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
  }
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector(&list);
  cfd::core::Script::~Script(&obj);
  std::__cxx11::string::~string((string *)&script);
  return;
}

Assistant:

TEST(Script, ParseCoinbaseScriptsigTest) {
  const std::string script = "03632b1e045352b260425443506f6f6cfabe6d6d4b081c2a3c7cb234c159b8e198294dfa79c04b54803e0e54c4a37d239445eb42020000007296cd100100000e8338000000000000";
  Script obj(script);
  EXPECT_EQ(script, obj.GetHex());
  auto list = obj.GetElementList();
  EXPECT_EQ(3, list.size());
  if (list.size() == 3) {
    EXPECT_EQ("03632b1e", list[0].GetData().GetHex());
    EXPECT_EQ("045352b260", list[1].GetData().GetHex());
    EXPECT_TRUE(list[2].IsBinary());
    // buffer size is low from length.
    EXPECT_EQ(
      "5443506f6f6cfabe6d6d4b081c2a3c7cb234c159b8e198294dfa79c04b54803e0e54c4a37d239445eb42020000007296cd100100000e8338000000000000",
      list[2].GetBinaryData().GetHex());
  }
}